

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int lws_sa46_write_numeric_address(lws_sockaddr46 *sa46,char *buf,size_t len)

{
  int iVar1;
  undefined8 in_RAX;
  
  *buf = '\0';
  if ((sa46->sa4).sin_family == 2) {
    iVar1 = lws_snprintf(buf,len,"%u.%u.%u.%u",(ulong)(byte)(sa46->sa4).sin_addr.s_addr,
                         (ulong)*(byte *)((long)&(sa46->sa4).sin_addr.s_addr + 1),
                         (ulong)*(byte *)((long)&(sa46->sa4).sin_addr.s_addr + 2),
                         CONCAT44((int)((ulong)in_RAX >> 0x20),
                                  (uint)*(byte *)((long)&(sa46->sa4).sin_addr.s_addr + 3)));
    return iVar1;
  }
  return -1;
}

Assistant:

int
lws_sa46_write_numeric_address(lws_sockaddr46 *sa46, char *buf, size_t len)
{
	*buf = '\0';
#if defined(LWS_WITH_IPV6)
	if (sa46->sa4.sin_family == AF_INET6)
		return lws_write_numeric_address(
				(uint8_t *)&sa46->sa6.sin6_addr, 16, buf, len);
#endif
	if (sa46->sa4.sin_family == AF_INET)
		return lws_write_numeric_address(
				(uint8_t *)&sa46->sa4.sin_addr, 4, buf, len);

	return -1;
}